

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.h
# Opt level: O0

void __thiscall BamTools::Internal::HostInfo::~HostInfo(HostInfo *this)

{
  string *in_RDI;
  vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  *unaff_retaddr;
  
  std::__cxx11::string::~string(in_RDI + 0x40);
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  ~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

class API_NO_EXPORT HostInfo
{

public:
    enum ErrorType
    {
        NoError = 0,
        HostNotFound,
        UnknownError
    };

    // ctors & dtor
public:
    HostInfo();

    // HostInfo interface
public:
    std::string HostName() const;
    void SetHostName(const std::string& name);

    std::vector<HostAddress> Addresses() const;
    void SetAddresses(const std::vector<HostAddress>& addresses);

    HostInfo::ErrorType GetError() const;
    std::string GetErrorString() const;

    // internal methods
private:
    void SetError(const HostInfo::ErrorType error);
    void SetErrorString(const std::string& errorString);

    // static methods
public:
    static HostInfo Lookup(const std::string& hostname, const std::string& port);

    // data members
private:
    std::string m_hostName;
    std::vector<HostAddress> m_addresses;
    HostInfo::ErrorType m_error;
    std::string m_errorString;
}